

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymesh_info.cpp
# Opt level: O0

ostream * CGL::Collada::operator<<(ostream *os,PolymeshInfo *polymesh)

{
  ostream *poVar1;
  size_type sVar2;
  long in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"PolymeshInfo: ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 0x28));
  poVar1 = std::operator<<(poVar1," (id:");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 8));
  std::operator<<(poVar1,")");
  std::operator<<(in_RDI," [");
  poVar1 = std::operator<<(in_RDI," num_polygons=");
  sVar2 = std::vector<CGL::Collada::Polygon,_std::allocator<CGL::Collada::Polygon>_>::size
                    ((vector<CGL::Collada::Polygon,_std::allocator<CGL::Collada::Polygon>_> *)
                     (in_RSI + 0x90));
  std::ostream::operator<<(poVar1,sVar2);
  poVar1 = std::operator<<(in_RDI," num_vertices=");
  sVar2 = std::vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::size
                    ((vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_> *)(in_RSI + 0x48));
  std::ostream::operator<<(poVar1,sVar2);
  poVar1 = std::operator<<(in_RDI," num_normals=");
  sVar2 = std::vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::size
                    ((vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_> *)(in_RSI + 0x60));
  std::ostream::operator<<(poVar1,sVar2);
  poVar1 = std::operator<<(in_RDI," num_texcoords=");
  sVar2 = std::vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>::size
                    ((vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_> *)(in_RSI + 0x78));
  std::ostream::operator<<(poVar1,sVar2);
  std::operator<<(in_RDI," ]");
  return in_RDI;
}

Assistant:

std::ostream& operator<<( std::ostream& os, const PolymeshInfo& polymesh ) {

  os << "PolymeshInfo: " << polymesh.name << " (id:" << polymesh.id << ")";

  os << " [";

    os << " num_polygons="  << polymesh.polygons.size();
    os << " num_vertices="  << polymesh.vertices.size();
    os << " num_normals="   << polymesh.normals.size();
    os << " num_texcoords=" << polymesh.texcoords.size();

  os << " ]";

  return os;

}